

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::verifyFloatSignedNorm<short>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  
  if (original_value != positive_value) {
    return false;
  }
  bVar3 = true;
  uVar1 = negated_value;
  uVar2 = positive_value;
  do {
    iVar4 = (int)(short)uVar2;
    iVar5 = -(int)(short)uVar1;
    if (!bVar3) {
      return iVar4 == iVar5;
    }
    bVar3 = false;
    uVar1 = (uint)negated_value >> 0x10;
    uVar2 = (uint)positive_value >> 0x10;
  } while (iVar4 == iVar5);
  return iVar4 == iVar5;
}

Assistant:

static bool verifyFloatSignedNorm(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		static const GLuint n_elements = sizeof(GLint) / sizeof(T); /* 1, 2, 4 */

		const T* positive_elements = (T*)&positive_value;
		const T* negated_elements  = (T*)&negated_value;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			const T positive_element = positive_elements[i];
			const T negated_element  = negated_elements[i];

			/* Compare data bits */
			if (positive_element != -negated_element)
			{
				return false;
			}
		}

		return true;
	}